

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

int __thiscall
mp::internal::TextReader<fmt::Locale>::ReadUInt(TextReader<fmt::Locale> *this,int *accumulator)

{
  int iVar1;
  int iVar2;
  int *in_RSI;
  TextReader<fmt::Locale> *in_RDI;
  CStringRef unaff_retaddr;
  int value;
  BasicCStringRef<char> local_20;
  int local_14;
  int *local_10;
  
  local_10 = in_RSI;
  local_14 = ReadUInt((TextReader<fmt::Locale> *)0x16752d);
  iVar1 = *local_10;
  iVar2 = std::numeric_limits<int>::max();
  if (iVar2 - local_14 < iVar1) {
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_20,"integer overflow");
    ReportError<>(in_RDI,unaff_retaddr);
  }
  *local_10 = local_14 + *local_10;
  return local_14;
}

Assistant:

int ReadUInt(int &accumulator) {
    int value = ReadUInt();
    if (accumulator > std::numeric_limits<int>::max() - value)
      ReportError("integer overflow");
    accumulator += value;
    return value;
  }